

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_gvec_2s_x86_64
               (TCGContext *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t oprsz,uint32_t maxsz,
               TCGv_i64 c,GVecGen2s *g)

{
  byte bVar1;
  _Bool scalar_first;
  TCGType TVar2;
  TCGv_vec ret;
  uint32_t uVar3;
  uint oprsz_00;
  TCGTemp *pTVar4;
  _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_vec *fni;
  uint32_t local_34;
  
  local_34 = maxsz;
  if ((g->fniv == (_func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_vec *)0x0) ||
     (TVar2 = choose_vector_type(tcg_ctx,g->opt_opc,(uint)g->vece,oprsz,g->prefer_i64),
     TVar2 == TCG_TYPE_I32)) {
    if ((oprsz - 8 < 0x20) &&
       (((oprsz & 7) == 0 &&
        (g->fni8 != (_func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64 *)0x0)))) {
      pTVar4 = tcg_temp_new_internal_x86_64(tcg_ctx,TCG_TYPE_I64,false);
      gen_dup_i64(tcg_ctx,(uint)g->vece,(TCGv_i64)((long)pTVar4 - (long)tcg_ctx),c);
      expand_2s_i64(tcg_ctx,dofs,aofs,oprsz,(TCGv_i64)((long)pTVar4 - (long)tcg_ctx),g->scalar_first
                    ,g->fni8);
      goto LAB_0053ea5b;
    }
    if ((0xf < oprsz - 4) ||
       (((oprsz & 3) != 0 ||
        (g->fni4 == (_func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32 *)0x0)))) {
      tcg_gen_gvec_2i_ool_x86_64(tcg_ctx,dofs,aofs,c,oprsz,maxsz,0,g->fno);
      return;
    }
    pTVar4 = tcg_temp_new_internal_x86_64(tcg_ctx,TCG_TYPE_I32,false);
    ret = (TCGv_vec)((long)pTVar4 - (long)tcg_ctx);
    tcg_gen_extrl_i64_i32_x86_64(tcg_ctx,(TCGv_i32)ret,c);
    if (g->vece == '\x01') {
      tcg_gen_deposit_i32_x86_64(tcg_ctx,(TCGv_i32)ret,(TCGv_i32)ret,(TCGv_i32)ret,0x10,0x10);
    }
    else if (g->vece == '\0') {
      tcg_gen_ext8u_i32_x86_64(tcg_ctx,(TCGv_i32)ret,(TCGv_i32)ret);
      tcg_gen_muli_i32_x86_64(tcg_ctx,(TCGv_i32)ret,(TCGv_i32)ret,0x1010101);
    }
    expand_2s_i32(tcg_ctx,dofs,aofs,oprsz,(TCGv_i32)ret,g->scalar_first,g->fni4);
  }
  else {
    ret = tcg_temp_new_vec_x86_64(tcg_ctx,TVar2);
    tcg_gen_dup_i64_vec_x86_64(tcg_ctx,(uint)g->vece,ret,c);
    if (TVar2 == TCG_TYPE_V64) {
      bVar1 = g->vece;
      scalar_first = g->scalar_first;
      uVar3 = 8;
      fni = g->fniv;
      TVar2 = TCG_TYPE_V64;
    }
    else {
      if (TVar2 != TCG_TYPE_V128) {
        if (TVar2 != TCG_TYPE_V256) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                     ,0x4b7,(char *)0x0);
        }
        oprsz_00 = oprsz & 0xffffffe0;
        expand_2s_vec(tcg_ctx,(uint)g->vece,dofs,aofs,oprsz_00,0x20,TCG_TYPE_V256,ret,
                      g->scalar_first,g->fniv);
        if (oprsz_00 == oprsz) goto LAB_0053ea58;
        dofs = dofs + oprsz_00;
        aofs = aofs + oprsz_00;
        oprsz = oprsz & 0x1f;
        local_34 = maxsz - oprsz_00;
      }
      bVar1 = g->vece;
      scalar_first = g->scalar_first;
      uVar3 = 0x10;
      fni = g->fniv;
      TVar2 = TCG_TYPE_V128;
    }
    expand_2s_vec(tcg_ctx,(uint)bVar1,dofs,aofs,oprsz,uVar3,TVar2,ret,scalar_first,fni);
  }
LAB_0053ea58:
  pTVar4 = (TCGTemp *)(ret + (long)tcg_ctx);
LAB_0053ea5b:
  tcg_temp_free_internal_x86_64(tcg_ctx,pTVar4);
  uVar3 = local_34 - oprsz;
  if (oprsz <= local_34 && uVar3 != 0) {
    do_dup(tcg_ctx,0,dofs + oprsz,uVar3,uVar3,(TCGv_i32)0x0,(TCGv_i64)0x0,0);
  }
  return;
}

Assistant:

void tcg_gen_gvec_2s(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t oprsz,
                     uint32_t maxsz, TCGv_i64 c, const GVecGen2s *g)
{
    TCGType type;

    check_size_align(oprsz, maxsz, dofs | aofs);
    check_overlap_2(dofs, aofs, maxsz);

    type = 0;
    if (g->fniv) {
        type = choose_vector_type(tcg_ctx, g->opt_opc, g->vece, oprsz, g->prefer_i64);
    }
    if (type != 0) {
        const TCGOpcode *this_list = g->opt_opc ? g->opt_opc : vecop_list_empty;
        const TCGOpcode *hold_list = tcg_swap_vecop_list(this_list);
        TCGv_vec t_vec = tcg_temp_new_vec(tcg_ctx, type);
        uint32_t some;

        tcg_gen_dup_i64_vec(tcg_ctx, g->vece, t_vec, c);

        switch (type) {
        case TCG_TYPE_V256:
            /* Recall that ARM SVE allows vector sizes that are not a
             * power of 2, but always a multiple of 16.  The intent is
             * that e.g. size == 80 would be expanded with 2x32 + 1x16.
             */
            some = QEMU_ALIGN_DOWN(oprsz, 32);
            expand_2s_vec(tcg_ctx, g->vece, dofs, aofs, some, 32, TCG_TYPE_V256,
                          t_vec, g->scalar_first, g->fniv);
            if (some == oprsz) {
                break;
            }
            dofs += some;
            aofs += some;
            oprsz -= some;
            maxsz -= some;
            /* fallthru */

        case TCG_TYPE_V128:
            expand_2s_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 16, TCG_TYPE_V128,
                          t_vec, g->scalar_first, g->fniv);
            break;

        case TCG_TYPE_V64:
            expand_2s_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 8, TCG_TYPE_V64,
                          t_vec, g->scalar_first, g->fniv);
            break;

        default:
            g_assert_not_reached();
        }
        tcg_temp_free_vec(tcg_ctx, t_vec);
        tcg_swap_vecop_list(hold_list);
    } else if (g->fni8 && check_size_impl(oprsz, 8)) {
        TCGv_i64 t64 = tcg_temp_new_i64(tcg_ctx);

        gen_dup_i64(tcg_ctx, g->vece, t64, c);
        expand_2s_i64(tcg_ctx, dofs, aofs, oprsz, t64, g->scalar_first, g->fni8);
        tcg_temp_free_i64(tcg_ctx, t64);
    } else if (g->fni4 && check_size_impl(oprsz, 4)) {
        TCGv_i32 t32 = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_extrl_i64_i32(tcg_ctx, t32, c);
        gen_dup_i32(tcg_ctx, g->vece, t32, t32);
        expand_2s_i32(tcg_ctx, dofs, aofs, oprsz, t32, g->scalar_first, g->fni4);
        tcg_temp_free_i32(tcg_ctx, t32);
    } else {
        tcg_gen_gvec_2i_ool(tcg_ctx, dofs, aofs, c, oprsz, maxsz, 0, g->fno);
        return;
    }

    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}